

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::GetUtf8Suffix_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field,Options *options)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (*(int *)(*(long *)(this + 0x28) + 0x3c) == 3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "UTF8";
    pcVar2 = "";
  }
  else {
    uVar1 = *(uint *)(field + 0x24);
    options = (Options *)(ulong)uVar1;
    if ((uVar1 == 1) ||
       ((uVar1 != 2 && (*(int *)(*(long *)(*(long *)(this + 0x28) + 0x88) + 0xa4) != 3)))) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "UTF8Verify";
      pcVar2 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "";
      pcVar3 = "";
    }
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar2,options);
  return __return_storage_ptr__;
}

Assistant:

std::string GetUtf8Suffix(const FieldDescriptor* field,
                          const Options& options) {
  switch (GetUtf8CheckMode(field, options)) {
    case STRICT:
      return "UTF8";
    case VERIFY:
      return "UTF8Verify";
    case NONE:
    default:  // Some build configs warn on missing return without default.
      return "";
  }
}